

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

void key_callback(GLFWwindow *self,int key,int scancode,int action,int mods)

{
  bov_window_t *window;
  char screenshot_name [64];
  
  screenshot_name[0x30] = '\0';
  screenshot_name[0x31] = '\0';
  screenshot_name[0x32] = '\0';
  screenshot_name[0x33] = '\0';
  screenshot_name[0x34] = '\0';
  screenshot_name[0x35] = '\0';
  screenshot_name[0x36] = '\0';
  screenshot_name[0x37] = '\0';
  screenshot_name[0x38] = '\0';
  screenshot_name[0x39] = '\0';
  screenshot_name[0x3a] = '\0';
  screenshot_name[0x3b] = '\0';
  screenshot_name[0x3c] = '\0';
  screenshot_name[0x3d] = '\0';
  screenshot_name[0x3e] = '\0';
  screenshot_name[0x3f] = '\0';
  screenshot_name[0x20] = '\0';
  screenshot_name[0x21] = '\0';
  screenshot_name[0x22] = '\0';
  screenshot_name[0x23] = '\0';
  screenshot_name[0x24] = '\0';
  screenshot_name[0x25] = '\0';
  screenshot_name[0x26] = '\0';
  screenshot_name[0x27] = '\0';
  screenshot_name[0x28] = '\0';
  screenshot_name[0x29] = '\0';
  screenshot_name[0x2a] = '\0';
  screenshot_name[0x2b] = '\0';
  screenshot_name[0x2c] = '\0';
  screenshot_name[0x2d] = '\0';
  screenshot_name[0x2e] = '\0';
  screenshot_name[0x2f] = '\0';
  screenshot_name[0x10] = '\0';
  screenshot_name[0x11] = '\0';
  screenshot_name[0x12] = '\0';
  screenshot_name[0x13] = '\0';
  screenshot_name[0x14] = '\0';
  screenshot_name[0x15] = '\0';
  screenshot_name[0x16] = '\0';
  screenshot_name[0x17] = '\0';
  screenshot_name[0x18] = '\0';
  screenshot_name[0x19] = '\0';
  screenshot_name[0x1a] = '\0';
  screenshot_name[0x1b] = '\0';
  screenshot_name[0x1c] = '\0';
  screenshot_name[0x1d] = '\0';
  screenshot_name[0x1e] = '\0';
  screenshot_name[0x1f] = '\0';
  builtin_strncpy(screenshot_name,"screenshot",0xb);
  screenshot_name[0xb] = '\0';
  screenshot_name[0xc] = '\0';
  screenshot_name[0xd] = '\0';
  screenshot_name[0xe] = '\0';
  screenshot_name[0xf] = '\0';
  window = (bov_window_t *)glfwGetWindowUserPointer(self);
  if (action - 1U < 2) {
    if (key == 0x20) {
      if (window->running == 0) {
        window->running = 1;
      }
      else {
        window->running = 0;
      }
    }
    else if ((key == 0x48) || (key == 0x4b)) {
      if (window->help_needed == 0) {
        window->help_needed = 1;
      }
      else {
        window->help_needed = 0;
      }
    }
    else if (key == 0x50) {
      key_callback::screenshot_nbr = key_callback::screenshot_nbr + 1;
      snprintf(screenshot_name + 10,0x36,"%u.ppm");
      bov_window_screenshot(window,screenshot_name);
    }
    else if (key == 0x52) {
      (window->param).zoom = 1.0;
      (window->param).translate[0] = 0.0;
      (window->param).translate[1] = 0.0;
    }
    else if (key == 0x109) {
      window->counter = window->counter + 1;
    }
    else if (key == 0x108) {
      window->counter = window->counter - 1;
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(self,1);
      goto LAB_00106a14;
    }
  }
  else if (key == 0x100) {
LAB_00106a14:
    glfwSetWindowShouldClose(self,1);
    return;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* self,
                         int key, int scancode, int action,int mods)
{
	static unsigned screenshot_nbr = 0;
	char screenshot_name[64] = "screenshot";
	bov_window_t* window = (bov_window_t*) glfwGetWindowUserPointer(self);
	if(action==GLFW_PRESS || action==GLFW_REPEAT) {
		switch(key) {
			case GLFW_KEY_ESCAPE:
				glfwSetWindowShouldClose(self,GL_TRUE);
				break;
			case GLFW_KEY_SPACE:
				if(window->running==0) {
					window->running = 1;
				}
				else {
					window->running = 0;
				}
				break;
			case GLFW_KEY_H:
			case GLFW_KEY_K:
				if(window->help_needed==0) {
					window->help_needed = 1;
				}
				else {
					window->help_needed = 0;
				}
				break;
			case GLFW_KEY_P:
				snprintf(screenshot_name + 10, 54, "%u.ppm", screenshot_nbr++);
				bov_window_screenshot(window, screenshot_name);
				break;
			case GLFW_KEY_R:
				window->param.zoom = 1.0f;
				window->param.translate[0] = 0.0f;
				window->param.translate[1] = 0.0f;
				break;
			case GLFW_KEY_UP:
				window->counter++;
				break;
			case GLFW_KEY_DOWN:
				window->counter--;
				break;
		}
	}
	if(key==GLFW_KEY_ESCAPE)
		glfwSetWindowShouldClose(self,GL_TRUE);
}